

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtrPool.h
# Opt level: O2

InstructionBegStr * __thiscall
Hpipe::PtrPool<Hpipe::Instruction,32>::operator<<
          (PtrPool<Hpipe::Instruction,32> *this,InstructionBegStr *ptr)

{
  void *pvVar1;
  int iVar2;
  
  iVar2 = *(int *)(this + 8);
  if (iVar2 == 0x20) {
    pvVar1 = operator_new(0x108);
    *(undefined8 *)((long)pvVar1 + 0x100) = *(undefined8 *)this;
    *(void **)this = pvVar1;
    iVar2 = 0;
  }
  else {
    pvVar1 = *(void **)this;
  }
  *(int *)(this + 8) = iVar2 + 1;
  *(InstructionBegStr **)((long)pvVar1 + (long)iVar2 * 8) = ptr;
  return ptr;
}

Assistant:

A *operator<<( A *ptr ) {
        if ( used == s ) {
            Set *n = new Set;
            n->prev = last;
            last = n;
            used = 0;
        }
        last->items[ used++ ] = ptr;
        return ptr;
    }